

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O0

void __thiscall DifferentialEquation::prepareNextState(DifferentialEquation *this)

{
  int iVar1;
  reference ppSVar2;
  long *plVar3;
  code *local_40;
  byte local_21;
  int local_18;
  byte local_11;
  int i;
  bool allStatesPrepared;
  DifferentialEquation *this_local;
  
  local_11 = 1;
  for (local_18 = 0; local_18 < this->eqnTermAmount; local_18 = local_18 + 1) {
    local_21 = 0;
    if (local_11 != 0) {
      ppSVar2 = std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::operator[]
                          (&this->eqnIntegrators,(long)local_18);
      iVar1 = (*((*ppSVar2)->super_StochasticProcess).super_Parametric._vptr_Parametric[6])();
      local_21 = (byte)iVar1;
    }
    local_11 = local_21 & 1;
  }
  if (local_11 == 0) {
    (this->super_StochasticVariable).super_StochasticProcess.stochNextStateIsPrepared = false;
  }
  else {
    local_40 = (code *)this->eqnMethodPtr;
    plVar3 = (long *)((long)&(this->super_StochasticVariable).super_StochasticProcess.
                             super_Parametric._vptr_Parametric + *(long *)&this->field_0x158);
    if (((ulong)local_40 & 1) != 0) {
      local_40 = *(code **)(local_40 + *plVar3 + -1);
    }
    (*local_40)(plVar3);
    (this->super_StochasticVariable).super_StochasticProcess.stochNextStateIsPrepared = true;
  }
  return;
}

Assistant:

void DifferentialEquation::prepareNextState()
{
	bool allStatesPrepared = true;
	for (int i=0; i<eqnTermAmount; ++i)
		allStatesPrepared = allStatesPrepared && (*eqnIntegrators[i]).isNextStatePrepared();
	
	if (allStatesPrepared) {
		(this->*eqnMethodPtr)();
		stochNextStateIsPrepared = true;
	}
	else
		stochNextStateIsPrepared = false;
}